

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

bool __thiscall
wasm::analysis::Vector<wasm::analysis::Bool>::meetAtIndex
          (Vector<wasm::analysis::Bool> *this,Element *meetee,size_t i,Element *elem)

{
  byte bVar1;
  reference rVar2;
  
  rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](meetee,i);
  bVar1 = (*rVar2._M_p & rVar2._M_mask) == 0 | *elem;
  if (bVar1 == 0) {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](meetee,i);
    *rVar2._M_p = *rVar2._M_p & ~rVar2._M_mask;
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool meetAtIndex(Element& meetee,
                   size_t i,
                   const typename L::Element& elem) const noexcept {
    if constexpr (std::is_same_v<typename L::Element, bool>) {
      // The vector<bool> specialization does not expose references to the
      // individual bools because they might be in a bitmap, so we need a
      // workaround.
      bool e = meetee[i];
      if (lattice.meet(e, elem)) {
        meetee[i] = e;
        return true;
      }
      return false;
    } else {
      return lattice.meet(meetee[i], elem);
    }
  }